

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::GoniometricLight::Phi(GoniometricLight *this,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  size_t sVar2;
  float *pfVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar14;
  undefined1 auVar12 [16];
  float fVar15;
  undefined1 auVar13 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar21 [56];
  float fVar22;
  undefined1 in_ZMM2 [64];
  SampledSpectrum SVar23;
  uint local_a8;
  undefined1 auStack_a4 [12];
  float local_98;
  undefined1 local_60 [32];
  size_t local_40;
  size_t local_38;
  undefined1 auVar16 [56];
  undefined1 auVar20 [64];
  
  TVar1 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  iVar7 = TVar1.y;
  uVar8 = TVar1.x;
  if (iVar7 < 1) {
    auVar19 = ZEXT1664(ZEXT816(0) << 0x40);
  }
  else {
    auVar13 = ZEXT464(0) << 0x20;
    uVar6 = 0;
    do {
      local_a8 = auVar13._0_4_;
      fVar9 = sinf((((float)(int)uVar6 + 0.5) * 3.1415927) / (float)iVar7);
      if ((int)uVar8 < 1) {
        auVar19 = ZEXT464(auVar13._0_4_);
      }
      else {
        uVar5 = 0;
        do {
          Image::GetChannels((ImageChannelValues *)local_60,&this->image,
                             (Point2i)(uVar6 << 0x20 | uVar5),
                             (array<pbrt::WrapMode,_2>)
                             *(array<pbrt::WrapMode,_2> *)(this->wrapMode).wrap.values);
          sVar2 = local_38;
          if (local_38 == 0) {
            fVar10 = 0.0;
          }
          else {
            pfVar3 = (float *)local_60._8_8_;
            if ((float *)local_60._8_8_ == (float *)0x0) {
              pfVar3 = (float *)(local_60 + 0x10);
            }
            fVar10 = 0.0;
            sVar4 = 0;
            do {
              fVar10 = fVar10 + pfVar3[sVar4];
              sVar4 = sVar4 + 1;
            } while (local_38 != sVar4);
          }
          local_38 = 0;
          (*(*(_func_int ***)local_60._0_8_)[3])(local_60._0_8_,local_60._8_8_,local_40 << 2,4);
          auVar17 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,sVar2);
          auVar17._0_4_ = fVar10 / auVar17._0_4_;
          auVar17._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar17 = vfmadd213ss_fma(auVar17,ZEXT416((uint)fVar9),ZEXT416(local_a8));
          auVar19 = ZEXT1664(auVar17);
          uVar5 = uVar5 + 1;
          local_a8 = auVar17._0_4_;
        } while (uVar5 != (uVar8 & 0x7fffffff));
      }
      uVar6 = uVar6 + 1;
      auVar13 = ZEXT1664(auVar19._0_16_);
    } while (uVar6 != (ulong)TVar1 >> 0x20);
  }
  auVar21 = auVar19._8_56_;
  fVar9 = this->scale;
  auVar11._4_4_ = fVar9;
  auVar11._0_4_ = fVar9;
  auVar11._8_4_ = fVar9;
  auVar11._12_4_ = fVar9;
  auVar16 = ZEXT856(auVar11._8_8_);
  SVar23 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar20._0_8_ = SVar23.values.values._8_8_;
  auVar20._8_56_ = auVar21;
  auVar13._0_8_ = SVar23.values.values._0_8_;
  auVar13._8_56_ = auVar16;
  auVar17 = vmovlhps_avx(auVar13._0_16_,auVar20._0_16_);
  fVar10 = auVar17._0_4_ * fVar9;
  fVar14 = auVar17._4_4_ * fVar9;
  fVar15 = auVar17._8_4_ * fVar9;
  fVar9 = auVar17._12_4_ * fVar9;
  local_98 = auVar19._0_4_;
  fVar22 = (float)(int)(iVar7 * uVar8);
  auVar12._0_4_ = local_98 * (fVar10 + fVar10) * 3.1415927 * 3.1415927;
  auVar12._4_4_ = local_98 * (fVar14 + fVar14) * 3.1415927 * 3.1415927;
  auVar12._8_4_ = local_98 * (fVar15 + fVar15) * 3.1415927 * 3.1415927;
  auVar12._12_4_ = local_98 * (fVar9 + fVar9) * 3.1415927 * 3.1415927;
  auVar18._4_4_ = fVar22;
  auVar18._0_4_ = fVar22;
  auVar18._8_4_ = fVar22;
  auVar18._12_4_ = fVar22;
  auVar17 = vdivps_avx(auVar12,auVar18);
  auVar11 = vshufpd_avx(auVar17,auVar17,1);
  SVar23.values.values._0_8_ = auVar17._0_8_;
  SVar23.values.values._8_8_ = auVar11._0_8_;
  return (SampledSpectrum)SVar23.values.values;
}

Assistant:

SampledSpectrum GoniometricLight::Phi(const SampledWavelengths &lambda) const {
    // integrate over speherical coordinates [0,Pi], [0,2pi]
    Float sumY = 0;
    int width = image.Resolution().x, height = image.Resolution().y;
    for (int v = 0; v < height; ++v) {
        Float sinTheta = std::sin(Pi * Float(v + .5f) / Float(height));
        for (int u = 0; u < width; ++u)
            sumY += sinTheta * image.GetChannels({u, v}, wrapMode).Average();
    }
    return scale * I.Sample(lambda) * 2 * Pi * Pi * sumY / (width * height);
}